

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

char * __thiscall Bstrlib::CBString::gets(CBString *this,char *__s)

{
  CBStringException *this_00;
  bstring x;
  char in_CL;
  void *in_RDX;
  bstring b;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  CBStringException bstr__cppwrapper_exception;
  char terminator_local;
  void *parm_local;
  bNgetc getcPtr_local;
  CBString *this_local;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"CBString::Write protection error",&local_79);
    CBStringException::CBStringException((CBStringException *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_58);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  x = bgets((bNgetc)__s,in_RDX,in_CL);
  if (x == (bstring)0x0) {
    (this->super_tagbstring).slen = 0;
    this_local._4_4_ = 0xffffffff;
  }
  else {
    operator=(this,x);
    bdestroy(x);
    this_local._4_4_ = 0;
  }
  return (char *)(ulong)this_local._4_4_;
}

Assistant:

int CBString::gets (bNgetc getcPtr, void * parm, char terminator) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	bstring b = bgets (getcPtr, parm, terminator);
	if (b == NULL) {
		slen = 0;
		return -1;
	}
	*this = *b;
	bdestroy (b);
	return 0;
}